

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O3

uint embree::getNumberOfLogicalThreads(void)

{
  int iVar1;
  pthread_t __th;
  cpu_set_t set;
  cpu_set_t local_80;
  
  if (getNumberOfLogicalThreads::nThreads == -1) {
    __th = pthread_self();
    iVar1 = pthread_getaffinity_np(__th,0x80,&local_80);
    if (iVar1 == 0) {
      getNumberOfLogicalThreads::nThreads = __sched_cpucount(0x80,&local_80);
    }
    return getNumberOfLogicalThreads::nThreads;
  }
  return getNumberOfLogicalThreads::nThreads;
}

Assistant:

unsigned int getNumberOfLogicalThreads() 
  {
    static int nThreads = -1;
    if (nThreads != -1) return nThreads;

#if defined(__MACOSX__) || defined(__ANDROID__)
    nThreads = sysconf(_SC_NPROCESSORS_ONLN); // does not work in Linux LXC container
    assert(nThreads);
#elif defined(__EMSCRIPTEN__)
    // WebAssembly supports pthreads, but not pthread_getaffinity_np. Get the number of logical
    // threads from the browser or Node.js using JavaScript.
    nThreads = MAIN_THREAD_EM_ASM_INT({
        const isBrowser = typeof window !== 'undefined';
        const isNode = typeof process !== 'undefined' && process.versions != null &&
            process.versions.node != null;
        if (isBrowser) {
            // Return 1 if the browser does not expose hardwareConcurrency.
            return window.navigator.hardwareConcurrency || 1;
        } else if (isNode) {
            return require('os').cpus().length;
        } else {
            return 1;
        }
    });
#else
    cpu_set_t set;
    if (pthread_getaffinity_np(pthread_self(), sizeof(set), &set) == 0)
      nThreads = CPU_COUNT(&set);
#endif
    
    assert(nThreads);
    return nThreads;
  }